

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

Value __thiscall jbcoin::STObject::getJson(STObject *this,int options)

{
  long lVar1;
  long lVar2;
  int iVar3;
  Value *this_00;
  undefined4 in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  long lVar5;
  Value VVar6;
  Value local_60;
  string key;
  
  Json::Value::Value((Value *)this,objectValue);
  lVar1 = *(long *)(CONCAT44(in_register_00000034,options) + 0x18);
  uVar4 = extraout_RDX;
  for (lVar5 = *(long *)(CONCAT44(in_register_00000034,options) + 0x10); lVar5 != lVar1;
      lVar5 = lVar5 + 0x60) {
    iVar3 = (**(code **)(**(long **)(lVar5 + 0x50) + 0x20))();
    uVar4 = extraout_RDX_00;
    if (iVar3 != 0) {
      lVar2 = *(long *)(*(long *)(lVar5 + 0x50) + 8);
      if (*(long *)(lVar2 + 0x18) == 0) {
        std::__cxx11::to_string(&key,1);
      }
      else {
        std::__cxx11::string::string((string *)&key,(string *)(lVar2 + 0x40));
      }
      (**(code **)(**(long **)(lVar5 + 0x50) + 0x38))(&local_60,*(long **)(lVar5 + 0x50),in_EDX);
      this_00 = Json::Value::operator[]((Value *)this,key._M_dataplus._M_p);
      Json::Value::swap(this_00,&local_60);
      Json::Value::~Value(&local_60);
      std::__cxx11::string::~string((string *)&key);
      uVar4 = extraout_RDX_01;
    }
  }
  VVar6._8_8_ = uVar4;
  VVar6.value_.map_ = (ObjectValues *)this;
  return VVar6;
}

Assistant:

Json::Value STObject::getJson (int options) const
{
    Json::Value ret (Json::objectValue);

    // TODO(tom): this variable is never changed...?
    int index = 1;
    for (auto const& elem : v_)
    {
        if (elem->getSType () != STI_NOTPRESENT)
        {
            auto const& n = elem->getFName ();
            auto key = n.hasName () ? std::string(n.getJsonName ()) :
                    std::to_string (index);
            ret[key] = elem->getJson (options);
        }
    }
    return ret;
}